

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O1

void __thiscall
nnad::Matrix<double>::Matrix
          (Matrix<double> *this,Matrix<double> *x,function<double_(const_double_&)> *f)

{
  vector<double,_std::allocator<double>_> *this_00;
  int iVar1;
  int iVar2;
  pointer pdVar3;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  double dVar7;
  vector<double,_std::allocator<double>_> xv;
  vector<double,_std::allocator<double>_> local_40;
  
  iVar1 = x->_Lines;
  this->_Lines = iVar1;
  iVar2 = x->_Columns;
  this->_Columns = iVar2;
  this_00 = &this->_Matrix;
  std::vector<double,_std::allocator<double>_>::vector
            (this_00,(long)(iVar2 * iVar1),(allocator_type *)&local_40);
  std::vector<double,_std::allocator<double>_>::vector(&local_40,&x->_Matrix);
  if (0 < (int)((ulong)((long)local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 3)) {
    lVar5 = 0;
    lVar6 = 0;
    do {
      if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) {
        uVar4 = std::__throw_bad_function_call();
        pdVar3 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (pdVar3 != (pointer)0x0) {
          operator_delete(pdVar3,(long)(this->_Matrix).
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_end_of_storage - (long)pdVar3);
        }
        _Unwind_Resume(uVar4);
      }
      dVar7 = (*f->_M_invoker)((_Any_data *)f,
                               (double *)
                               ((long)local_40.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_start + lVar5));
      *(double *)
       ((long)(this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start + lVar5) = dVar7;
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 8;
    } while (lVar6 < (int)((ulong)((long)local_40.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_finish -
                                  (long)local_40.super__Vector_base<double,_std::allocator<double>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3));
  }
  if (local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

Matrix(Matrix const& x, std::function<T(T const&)> f):
      _Lines(x.GetLines()),
      _Columns(x.GetColumns()),
      _Matrix(_Lines * _Columns)
    {
      const std::vector<T> xv = x.GetVector();
      for (int i = 0; i < (int) xv.size(); i++)
        _Matrix[i] = f(xv[i]);
    }